

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

PerfEvents_Timebase * __thiscall
perfetto::protos::gen::PerfEvents_Timebase::operator=
          (PerfEvents_Timebase *this,PerfEvents_Timebase *param_1)

{
  uint64_t uVar1;
  
  this->counter_ = param_1->counter_;
  uVar1 = param_1->period_;
  this->frequency_ = param_1->frequency_;
  this->period_ = uVar1;
  protozero::CopyablePtr<perfetto::protos::gen::PerfEvents_Tracepoint>::operator=
            (&this->tracepoint_,&param_1->tracepoint_);
  protozero::CopyablePtr<perfetto::protos::gen::PerfEvents_RawEvent>::operator=
            (&this->raw_event_,&param_1->raw_event_);
  this->timestamp_clock_ = param_1->timestamp_clock_;
  ::std::__cxx11::string::_M_assign((string *)&this->name_);
  ::std::__cxx11::string::_M_assign((string *)&this->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

PerfEvents_Timebase::PerfEvents_Timebase(const PerfEvents_Timebase&) = default;